

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qabstractproxymodel.cpp
# Opt level: O2

void __thiscall
QAbstractProxyModelPrivate::scheduleHeaderUpdate
          (QAbstractProxyModelPrivate *this,Orientation orientation)

{
  byte bVar1;
  QObject *object;
  byte bVar2;
  QSlotObjectBase *slotObj;
  byte bVar3;
  long in_FS_OFFSET;
  void *local_48;
  char *pcStack_40;
  QMetaTypeInterface *local_38 [2];
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  bVar1 = this->field_0xe0;
  if (orientation == Vertical) {
    bVar3 = 4;
    bVar2 = bVar1 & 4;
  }
  else {
    if (orientation != Horizontal) goto LAB_0040e48a;
    bVar3 = 8;
    bVar2 = bVar1 & 8;
  }
  if ((bVar2 == 0) && (this->field_0xe0 = bVar3 | bVar1, (bVar1 & 0xc) == 0)) {
    object = (this->super_QAbstractItemModelPrivate).super_QObjectPrivate.super_QObjectData.q_ptr;
    local_48 = (void *)0x0;
    pcStack_40 = (char *)0x0;
    local_38[0] = &QtPrivate::QMetaTypeInterfaceWrapper<void>::metaType;
    slotObj = (QSlotObjectBase *)operator_new(0x18);
    (slotObj->m_ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
    super___atomic_base<int>._M_i = 1;
    slotObj->m_impl =
         QtPrivate::
         QCallableObject<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qt[P]qtbase/src/corelib/itemmodels/qabstractproxymodel.cpp:89:38),_QtPrivate::List<>,_void>
         ::impl;
    *(QAbstractProxyModelPrivate **)(slotObj + 1) = this;
    QMetaObject::invokeMethodImpl(object,slotObj,QueuedConnection,1,&local_48,&pcStack_40,local_38);
  }
LAB_0040e48a:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QAbstractProxyModelPrivate::scheduleHeaderUpdate(Qt::Orientation orientation)
{
    const bool isUpdateScheduled = updateHorizontalHeader || updateVerticalHeader;

    if (orientation == Qt::Horizontal && !updateHorizontalHeader)
        updateHorizontalHeader = true;
    else if (orientation == Qt::Vertical && !updateVerticalHeader)
        updateVerticalHeader = true;
    else
        return;

    if (!isUpdateScheduled) {
        Q_Q(QAbstractProxyModel);
        QMetaObject::invokeMethod(q, [this]() { emitHeaderDataChanged(); }, Qt::QueuedConnection);
    }
}